

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.cpp
# Opt level: O3

string * __thiscall
Diligent::SPIRVShaderResources::DumpResources_abi_cxx11_
          (string *__return_storage_ptr__,SPIRVShaderResources *this)

{
  ushort uVar1;
  ushort uVar2;
  char cVar3;
  string *psVar4;
  Uint32 UVar5;
  size_t sVar6;
  ostream *poVar7;
  SPIRVShaderResourceAttribs *pSVar8;
  long *plVar9;
  char (*Args_1) [30];
  Uint32 UVar10;
  Uint32 UVar11;
  char *pcVar12;
  Uint32 ResNum;
  string msg;
  anon_class_16_2_2bfcf79f DumpResource;
  stringstream ss;
  Uint32 local_1f4;
  string local_1f0;
  anon_class_16_2_2bfcf79f local_1d0;
  string *local_1c0;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Shader \'",8);
  pcVar12 = this->m_ShaderName;
  if (pcVar12 == (char *)0x0) {
    std::ios::clear((int)(ostream *)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
  }
  else {
    sVar6 = strlen(pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar12,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\' resource stats: total resources: ",0x23);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"UBs: ",5);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"; SBs: ",7);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"; Imgs: ",8);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"; Smpl Imgs: ",0xd);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"; ACs: ",7);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"; Sep Imgs: ",0xc);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"; Sep Smpls: ",0xd);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  local_1f0._M_dataplus._M_p._0_1_ = 0x2e;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_1f0,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Resources:",10);
  local_1d0.ResNum = &local_1f4;
  local_1f4 = 0;
  UVar5 = (Uint32)this->m_StorageBufferOffset;
  cVar3 = (char)(ostream *)local_1a8;
  local_1d0.ss = (stringstream *)local_1b8;
  local_1c0 = __return_storage_ptr__;
  if (this->m_StorageBufferOffset == 0) {
    UVar5 = 0;
  }
  else {
    UVar10 = 0;
    do {
      pSVar8 = GetResAttribs(this,UVar10,UVar5,0);
      if (pSVar8->Type != UniformBuffer) {
        FormatString<char[25]>(&local_1f0,(char (*) [25])"Unexpected resource type");
        DebugAssertionFailed
                  ((Char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                    local_1f0._M_dataplus._M_p._0_1_),"operator()",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                   ,0x36c);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
            &local_1f0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_
                                  ),local_1f0.field_2._M_allocated_capacity + 1);
        }
      }
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar3);
      std::ostream::put(cVar3);
      plVar9 = (long *)std::ostream::flush();
      *(undefined8 *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x10) = 3;
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)plVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," Uniform Buffer     ",0x14);
      DumpResources::anon_class_16_2_2bfcf79f::operator()(&local_1d0,pSVar8);
      UVar10 = UVar10 + 1;
      UVar5 = (Uint32)this->m_StorageBufferOffset;
    } while (UVar10 < UVar5);
  }
  uVar1 = this->m_StorageImageOffset;
  UVar10 = uVar1 - UVar5;
  if (UVar10 != 0) {
    UVar11 = 0;
    do {
      pSVar8 = GetResAttribs(this,UVar11,UVar10,UVar5);
      if (1 < (byte)(pSVar8->Type - ROStorageBuffer)) {
        FormatString<char[25]>(&local_1f0,(char (*) [25])"Unexpected resource type");
        DebugAssertionFailed
                  ((Char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                    local_1f0._M_dataplus._M_p._0_1_),"operator()",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                   ,0x375);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
            &local_1f0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_
                                  ),local_1f0.field_2._M_allocated_capacity + 1);
        }
      }
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar3);
      std::ostream::put(cVar3);
      plVar9 = (long *)std::ostream::flush();
      *(undefined8 *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x10) = 3;
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)plVar9);
      pcVar12 = " RW Storage Buffer  ";
      if (pSVar8->Type == ROStorageBuffer) {
        pcVar12 = " RO Storage Buffer  ";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar12,0x14);
      DumpResources::anon_class_16_2_2bfcf79f::operator()(&local_1d0,pSVar8);
      UVar11 = UVar11 + 1;
      uVar1 = this->m_StorageImageOffset;
      UVar5 = (Uint32)this->m_StorageBufferOffset;
      UVar10 = uVar1 - UVar5;
    } while (UVar11 < UVar10);
  }
  UVar5 = (Uint32)uVar1;
  uVar1 = this->m_SampledImageOffset;
  UVar10 = uVar1 - UVar5;
  if (UVar10 != 0) {
    UVar11 = 0;
    do {
      pSVar8 = GetResAttribs(this,UVar11,UVar10,UVar5);
      if (pSVar8->Type == StorageTexelBuffer) {
        std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar3);
        std::ostream::put(cVar3);
        plVar9 = (long *)std::ostream::flush();
        *(undefined8 *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x10) = 3;
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)plVar9);
        pcVar12 = " Storage Txl Buff ";
LAB_002a8a49:
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar12,0x12);
      }
      else {
        if (pSVar8->Type == StorageImage) {
          std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar3);
          std::ostream::put(cVar3);
          plVar9 = (long *)std::ostream::flush();
          *(undefined8 *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x10) = 3;
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)plVar9);
          pcVar12 = " Storage Image    ";
          goto LAB_002a8a49;
        }
        FormatString<char[25]>(&local_1f0,(char (*) [25])"Unexpected resource type");
        DebugAssertionFailed
                  ((Char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                    local_1f0._M_dataplus._M_p._0_1_),"operator()",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                   ,0x388);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
            &local_1f0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_
                                  ),local_1f0.field_2._M_allocated_capacity + 1);
        }
      }
      DumpResources::anon_class_16_2_2bfcf79f::operator()(&local_1d0,pSVar8);
      UVar11 = UVar11 + 1;
      uVar1 = this->m_SampledImageOffset;
      UVar5 = (Uint32)this->m_StorageImageOffset;
      UVar10 = uVar1 - UVar5;
    } while (UVar11 < UVar10);
  }
  UVar5 = (Uint32)uVar1;
  uVar1 = this->m_AtomicCounterOffset;
  UVar10 = uVar1 - UVar5;
  if (UVar10 != 0) {
    UVar11 = 0;
    do {
      pSVar8 = GetResAttribs(this,UVar11,UVar10,UVar5);
      if (pSVar8->Type == UniformTexelBuffer) {
        std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar3);
        std::ostream::put(cVar3);
        plVar9 = (long *)std::ostream::flush();
        *(undefined8 *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x10) = 3;
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)plVar9);
        pcVar12 = " Uniform Txl Buff ";
LAB_002a8b99:
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar12,0x12);
      }
      else {
        if (pSVar8->Type == SampledImage) {
          std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar3);
          std::ostream::put(cVar3);
          plVar9 = (long *)std::ostream::flush();
          *(undefined8 *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x10) = 3;
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)plVar9);
          pcVar12 = " Sampled Image    ";
          goto LAB_002a8b99;
        }
        FormatString<char[25]>(&local_1f0,(char (*) [25])"Unexpected resource type");
        DebugAssertionFailed
                  ((Char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                    local_1f0._M_dataplus._M_p._0_1_),"operator()",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                   ,0x398);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
            &local_1f0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_
                                  ),local_1f0.field_2._M_allocated_capacity + 1);
        }
      }
      DumpResources::anon_class_16_2_2bfcf79f::operator()(&local_1d0,pSVar8);
      UVar11 = UVar11 + 1;
      uVar1 = this->m_AtomicCounterOffset;
      UVar5 = (Uint32)this->m_SampledImageOffset;
      UVar10 = uVar1 - UVar5;
    } while (UVar11 < UVar10);
  }
  UVar5 = (Uint32)uVar1;
  uVar1 = this->m_SeparateSamplerOffset;
  UVar10 = uVar1 - UVar5;
  if (UVar10 != 0) {
    UVar11 = 0;
    do {
      pSVar8 = GetResAttribs(this,UVar11,UVar10,UVar5);
      if (pSVar8->Type != AtomicCounter) {
        FormatString<char[25]>(&local_1f0,(char (*) [25])"Unexpected resource type");
        DebugAssertionFailed
                  ((Char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                    local_1f0._M_dataplus._M_p._0_1_),"operator()",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                   ,0x39d);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
            &local_1f0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_
                                  ),local_1f0.field_2._M_allocated_capacity + 1);
        }
      }
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar3);
      std::ostream::put(cVar3);
      plVar9 = (long *)std::ostream::flush();
      *(undefined8 *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x10) = 3;
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)plVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," Atomic Cntr      ",0x12);
      DumpResources::anon_class_16_2_2bfcf79f::operator()(&local_1d0,pSVar8);
      UVar11 = UVar11 + 1;
      uVar1 = this->m_SeparateSamplerOffset;
      UVar5 = (Uint32)this->m_AtomicCounterOffset;
      UVar10 = uVar1 - UVar5;
    } while (UVar11 < UVar10);
  }
  UVar5 = (Uint32)uVar1;
  uVar1 = this->m_SeparateImageOffset;
  UVar10 = uVar1 - UVar5;
  if (UVar10 != 0) {
    UVar11 = 0;
    do {
      pSVar8 = GetResAttribs(this,UVar11,UVar10,UVar5);
      if (pSVar8->Type != SeparateSampler) {
        FormatString<char[25]>(&local_1f0,(char (*) [25])"Unexpected resource type");
        DebugAssertionFailed
                  ((Char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                    local_1f0._M_dataplus._M_p._0_1_),"operator()",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                   ,0x3a4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
            &local_1f0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_
                                  ),local_1f0.field_2._M_allocated_capacity + 1);
        }
      }
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar3);
      std::ostream::put(cVar3);
      plVar9 = (long *)std::ostream::flush();
      *(undefined8 *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x10) = 3;
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)plVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," Separate Smpl    ",0x12);
      DumpResources::anon_class_16_2_2bfcf79f::operator()(&local_1d0,pSVar8);
      UVar11 = UVar11 + 1;
      uVar1 = this->m_SeparateImageOffset;
      UVar5 = (Uint32)this->m_SeparateSamplerOffset;
      UVar10 = uVar1 - UVar5;
    } while (UVar11 < UVar10);
  }
  UVar5 = (Uint32)uVar1;
  uVar1 = this->m_InputAttachmentOffset;
  UVar10 = uVar1 - UVar5;
  if (UVar10 != 0) {
    UVar11 = 0;
    do {
      pSVar8 = GetResAttribs(this,UVar11,UVar10,UVar5);
      if (pSVar8->Type != SeparateImage) {
        FormatString<char[25]>(&local_1f0,(char (*) [25])"Unexpected resource type");
        DebugAssertionFailed
                  ((Char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                    local_1f0._M_dataplus._M_p._0_1_),"operator()",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                   ,0x3ab);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
            &local_1f0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_
                                  ),local_1f0.field_2._M_allocated_capacity + 1);
        }
      }
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar3);
      std::ostream::put(cVar3);
      plVar9 = (long *)std::ostream::flush();
      *(undefined8 *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x10) = 3;
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)plVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," Separate Img     ",0x12);
      DumpResources::anon_class_16_2_2bfcf79f::operator()(&local_1d0,pSVar8);
      UVar11 = UVar11 + 1;
      uVar1 = this->m_InputAttachmentOffset;
      UVar5 = (Uint32)this->m_SeparateImageOffset;
      UVar10 = uVar1 - UVar5;
    } while (UVar11 < UVar10);
  }
  UVar5 = (Uint32)uVar1;
  uVar1 = this->m_AccelStructOffset;
  UVar10 = uVar1 - UVar5;
  if (UVar10 != 0) {
    UVar11 = 0;
    do {
      pSVar8 = GetResAttribs(this,UVar11,UVar10,UVar5);
      if (pSVar8->Type != InputAttachment) {
        FormatString<char[25]>(&local_1f0,(char (*) [25])"Unexpected resource type");
        DebugAssertionFailed
                  ((Char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                    local_1f0._M_dataplus._M_p._0_1_),"operator()",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                   ,0x3b2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
            &local_1f0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_
                                  ),local_1f0.field_2._M_allocated_capacity + 1);
        }
      }
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar3);
      std::ostream::put(cVar3);
      plVar9 = (long *)std::ostream::flush();
      *(undefined8 *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x10) = 3;
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)plVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," Input Attachment ",0x12);
      DumpResources::anon_class_16_2_2bfcf79f::operator()(&local_1d0,pSVar8);
      UVar11 = UVar11 + 1;
      uVar1 = this->m_AccelStructOffset;
      UVar5 = (Uint32)this->m_InputAttachmentOffset;
      UVar10 = uVar1 - UVar5;
    } while (UVar11 < UVar10);
  }
  Args_1 = (char (*) [30])(ulong)uVar1;
  uVar2 = this->m_TotalResources;
  UVar5 = (uint)uVar2 - (uint)uVar1;
  if (UVar5 != 0) {
    UVar10 = 0;
    do {
      pSVar8 = GetResAttribs(this,UVar10,UVar5,(Uint32)Args_1);
      if (pSVar8->Type != AccelerationStructure) {
        FormatString<char[25]>(&local_1f0,(char (*) [25])"Unexpected resource type");
        DebugAssertionFailed
                  ((Char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                    local_1f0._M_dataplus._M_p._0_1_),"operator()",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                   ,0x3b9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
            &local_1f0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_
                                  ),local_1f0.field_2._M_allocated_capacity + 1);
        }
      }
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar3);
      std::ostream::put(cVar3);
      plVar9 = (long *)std::ostream::flush();
      *(undefined8 *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x10) = 3;
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)plVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," Accel Struct     ",0x12);
      DumpResources::anon_class_16_2_2bfcf79f::operator()(&local_1d0,pSVar8);
      UVar10 = UVar10 + 1;
      uVar2 = this->m_TotalResources;
      Args_1 = (char (*) [30])(ulong)this->m_AccelStructOffset;
      UVar5 = (uint)uVar2 - (uint)this->m_AccelStructOffset;
    } while (UVar10 < UVar5);
  }
  psVar4 = local_1c0;
  if (local_1f4 != uVar2) {
    FormatString<char[26],char[30]>
              (&local_1f0,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ResNum == GetTotalResources()",Args_1);
    DebugAssertionFailed
              ((Char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_),
               "DumpResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x3bf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
        &local_1f0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_),
                      local_1f0.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

std::string SPIRVShaderResources::DumpResources() const
{
    std::stringstream ss;
    ss << "Shader '" << m_ShaderName << "' resource stats: total resources: " << GetTotalResources() << ":" << std::endl
       << "UBs: " << GetNumUBs() << "; SBs: " << GetNumSBs() << "; Imgs: " << GetNumImgs() << "; Smpl Imgs: " << GetNumSmpldImgs()
       << "; ACs: " << GetNumACs() << "; Sep Imgs: " << GetNumSepImgs() << "; Sep Smpls: " << GetNumSepSmplrs() << '.' << std::endl
       << "Resources:";

    Uint32 ResNum       = 0;
    auto   DumpResource = [&ss, &ResNum](const SPIRVShaderResourceAttribs& Res) {
        std::stringstream FullResNameSS;
        FullResNameSS << '\'' << Res.Name;
        if (Res.ArraySize > 1)
            FullResNameSS << '[' << Res.ArraySize << ']';
        FullResNameSS << '\'';
        ss << std::setw(32) << FullResNameSS.str();
        ++ResNum;
    };

    ProcessResources(
        [&](const SPIRVShaderResourceAttribs& UB, Uint32) //
        {
            VERIFY(UB.Type == SPIRVShaderResourceAttribs::ResourceType::UniformBuffer, "Unexpected resource type");
            ss << std::endl
               << std::setw(3) << ResNum << " Uniform Buffer     ";
            DumpResource(UB);
        },
        [&](const SPIRVShaderResourceAttribs& SB, Uint32) //
        {
            VERIFY(SB.Type == SPIRVShaderResourceAttribs::ResourceType::ROStorageBuffer ||
                       SB.Type == SPIRVShaderResourceAttribs::ResourceType::RWStorageBuffer,
                   "Unexpected resource type");
            ss << std::endl
               << std::setw(3) << ResNum
               << (SB.Type == SPIRVShaderResourceAttribs::ResourceType::ROStorageBuffer ? " RO Storage Buffer  " : " RW Storage Buffer  ");
            DumpResource(SB);
        },
        [&](const SPIRVShaderResourceAttribs& Img, Uint32) //
        {
            if (Img.Type == SPIRVShaderResourceAttribs::ResourceType::StorageImage)
            {
                ss << std::endl
                   << std::setw(3) << ResNum << " Storage Image    ";
            }
            else if (Img.Type == SPIRVShaderResourceAttribs::ResourceType::StorageTexelBuffer)
            {
                ss << std::endl
                   << std::setw(3) << ResNum << " Storage Txl Buff ";
            }
            else
                UNEXPECTED("Unexpected resource type");
            DumpResource(Img);
        },
        [&](const SPIRVShaderResourceAttribs& SmplImg, Uint32) //
        {
            if (SmplImg.Type == SPIRVShaderResourceAttribs::ResourceType::SampledImage)
            {
                ss << std::endl
                   << std::setw(3) << ResNum << " Sampled Image    ";
            }
            else if (SmplImg.Type == SPIRVShaderResourceAttribs::ResourceType::UniformTexelBuffer)
            {
                ss << std::endl
                   << std::setw(3) << ResNum << " Uniform Txl Buff ";
            }
            else
                UNEXPECTED("Unexpected resource type");
            DumpResource(SmplImg);
        },
        [&](const SPIRVShaderResourceAttribs& AC, Uint32) //
        {
            VERIFY(AC.Type == SPIRVShaderResourceAttribs::ResourceType::AtomicCounter, "Unexpected resource type");
            ss << std::endl
               << std::setw(3) << ResNum << " Atomic Cntr      ";
            DumpResource(AC);
        },
        [&](const SPIRVShaderResourceAttribs& SepSmpl, Uint32) //
        {
            VERIFY(SepSmpl.Type == SPIRVShaderResourceAttribs::ResourceType::SeparateSampler, "Unexpected resource type");
            ss << std::endl
               << std::setw(3) << ResNum << " Separate Smpl    ";
            DumpResource(SepSmpl);
        },
        [&](const SPIRVShaderResourceAttribs& SepImg, Uint32) //
        {
            VERIFY(SepImg.Type == SPIRVShaderResourceAttribs::ResourceType::SeparateImage, "Unexpected resource type");
            ss << std::endl
               << std::setw(3) << ResNum << " Separate Img     ";
            DumpResource(SepImg);
        },
        [&](const SPIRVShaderResourceAttribs& InptAtt, Uint32) //
        {
            VERIFY(InptAtt.Type == SPIRVShaderResourceAttribs::ResourceType::InputAttachment, "Unexpected resource type");
            ss << std::endl
               << std::setw(3) << ResNum << " Input Attachment ";
            DumpResource(InptAtt);
        },
        [&](const SPIRVShaderResourceAttribs& AccelStruct, Uint32) //
        {
            VERIFY(AccelStruct.Type == SPIRVShaderResourceAttribs::ResourceType::AccelerationStructure, "Unexpected resource type");
            ss << std::endl
               << std::setw(3) << ResNum << " Accel Struct     ";
            DumpResource(AccelStruct);
        } //
    );
    VERIFY_EXPR(ResNum == GetTotalResources());

    return ss.str();
}